

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-and-recv.c
# Opt level: O3

void alloc_cb(uv_handle_t *handle,size_t suggested_size,uv_buf_t *buf)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  long in_RCX;
  undefined8 *extraout_RDX;
  uv_udp_t *unaff_RBX;
  uv_udp_t *puVar6;
  int in_R8D;
  uv_buf_t uStack_678;
  undefined1 auStack_666 [18];
  undefined8 uStack_654;
  undefined8 uStack_64c;
  undefined8 uStack_644;
  undefined8 uStack_63c;
  undefined8 uStack_634;
  undefined8 uStack_62c;
  undefined8 uStack_624;
  undefined8 uStack_61c;
  undefined8 uStack_614;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined8 uStack_600;
  undefined1 auStack_5f8 [536];
  uv_loop_t *puStack_3e0;
  code *pcStack_3d8;
  uv_buf_t uStack_3d0;
  sockaddr_in sStack_3c0;
  uv_udp_t uStack_3b0;
  uv_udp_t uStack_2d8;
  uv_loop_t *puStack_200;
  sockaddr_in sStack_1f0;
  uv_udp_t uStack_1e0;
  uv_loop_t *puStack_108;
  uv_udp_t uStack_100;
  uv_udp_t *puStack_28;
  
  if (suggested_size < 0x10001) {
    buf->base = alloc_cb::slab;
    buf->len = 0x10000;
    return;
  }
  alloc_cb_cold_1();
  if ((long)suggested_size < 0) {
    recv_cb_cold_7();
    puVar6 = (uv_udp_t *)handle;
LAB_00178ab7:
    recv_cb_cold_1();
LAB_00178abc:
    recv_cb_cold_5();
LAB_00178ac1:
    recv_cb_cold_2();
LAB_00178ac6:
    recv_cb_cold_3();
LAB_00178acb:
    recv_cb_cold_4();
    handle = (uv_handle_t *)puVar6;
  }
  else {
    if (suggested_size != 0) {
      puVar6 = (uv_udp_t *)handle;
      if (in_R8D != 0) goto LAB_00178ab7;
      if (in_RCX == 0) goto LAB_00178abc;
      if (suggested_size != 4) goto LAB_00178ac1;
      if (*(int *)*extraout_RDX != 0x474e4950) goto LAB_00178ac6;
      iVar1 = uv_udp_recv_stop((uv_udp_t *)handle);
      unaff_RBX = (uv_udp_t *)handle;
      if (iVar1 == 0) {
        uv_close(handle,close_cb);
        return;
      }
      goto LAB_00178acb;
    }
    if (in_RCX == 0) {
      return;
    }
  }
  iVar1 = (int)suggested_size;
  recv_cb_cold_6();
  if ((uv_udp_t *)handle == (uv_udp_t *)0x0) {
    send_cb_cold_2();
  }
  else if (iVar1 == 0) {
    send_cb_called = send_cb_called + 1;
    uv_close((uv_handle_t *)(((uv_udp_t *)handle)->u).reserved[2],close_cb);
    return;
  }
  send_cb_cold_1();
  puStack_108 = (uv_loop_t *)0x178b0e;
  puStack_28 = unaff_RBX;
  uVar2 = create_udp_socket();
  puStack_108 = (uv_loop_t *)0x178b15;
  uVar3 = create_udp_socket();
  puVar5 = (uv_loop_t *)(ulong)uVar3;
  puStack_108 = (uv_loop_t *)0x178b1c;
  puVar4 = uv_default_loop();
  puStack_108 = (uv_loop_t *)0x178b27;
  iVar1 = uv_udp_init(puVar4,&uStack_100);
  if (iVar1 == 0) {
    puStack_108 = (uv_loop_t *)0x178b39;
    iVar1 = uv_udp_open(&uStack_100,uVar2);
    if (iVar1 != 0) goto LAB_00178bb5;
    puStack_108 = (uv_loop_t *)0x178b47;
    iVar1 = uv_udp_open(&uStack_100,uVar3);
    if (iVar1 != -0x10) goto LAB_00178bba;
    puStack_108 = (uv_loop_t *)0x178b53;
    iVar1 = close(uVar3);
    if (iVar1 != 0) goto LAB_00178bbf;
    puStack_108 = (uv_loop_t *)0x178b61;
    uv_close((uv_handle_t *)&uStack_100,(uv_close_cb)0x0);
    puStack_108 = (uv_loop_t *)0x178b66;
    puVar4 = uv_default_loop();
    puStack_108 = (uv_loop_t *)0x178b70;
    uv_run(puVar4,UV_RUN_DEFAULT);
    puStack_108 = (uv_loop_t *)0x178b75;
    puVar5 = uv_default_loop();
    puStack_108 = (uv_loop_t *)0x178b89;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    puStack_108 = (uv_loop_t *)0x178b93;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_108 = (uv_loop_t *)0x178b98;
    puVar4 = uv_default_loop();
    puStack_108 = (uv_loop_t *)0x178ba0;
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    puStack_108 = (uv_loop_t *)0x178bb5;
    run_test_udp_open_twice_cold_1();
LAB_00178bb5:
    puStack_108 = (uv_loop_t *)0x178bba;
    run_test_udp_open_twice_cold_2();
LAB_00178bba:
    puStack_108 = (uv_loop_t *)0x178bbf;
    run_test_udp_open_twice_cold_3();
LAB_00178bbf:
    puStack_108 = (uv_loop_t *)0x178bc4;
    run_test_udp_open_twice_cold_4();
  }
  puStack_108 = (uv_loop_t *)run_test_udp_open_bound;
  run_test_udp_open_twice_cold_5();
  puStack_200 = (uv_loop_t *)0x178be7;
  puStack_108 = puVar5;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_1f0);
  if (iVar1 == 0) {
    puStack_200 = (uv_loop_t *)0x178bf4;
    uVar3 = create_udp_socket();
    puVar5 = (uv_loop_t *)(ulong)uVar3;
    puStack_200 = (uv_loop_t *)0x178c07;
    iVar1 = bind(uVar3,(sockaddr *)&sStack_1f0,0x10);
    if (iVar1 != 0) goto LAB_00178cb8;
    puStack_200 = (uv_loop_t *)0x178c14;
    puVar4 = uv_default_loop();
    puStack_200 = (uv_loop_t *)0x178c21;
    iVar1 = uv_udp_init(puVar4,&uStack_1e0);
    if (iVar1 != 0) goto LAB_00178cbd;
    puStack_200 = (uv_loop_t *)0x178c35;
    iVar1 = uv_udp_open(&uStack_1e0,uVar3);
    if (iVar1 != 0) goto LAB_00178cc2;
    puStack_200 = (uv_loop_t *)0x178c55;
    iVar1 = uv_udp_recv_start(&uStack_1e0,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_00178cc7;
    puStack_200 = (uv_loop_t *)0x178c65;
    uv_close((uv_handle_t *)&uStack_1e0,(uv_close_cb)0x0);
    puStack_200 = (uv_loop_t *)0x178c6a;
    puVar4 = uv_default_loop();
    puStack_200 = (uv_loop_t *)0x178c74;
    uv_run(puVar4,UV_RUN_DEFAULT);
    puStack_200 = (uv_loop_t *)0x178c79;
    puVar5 = uv_default_loop();
    puStack_200 = (uv_loop_t *)0x178c8d;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    puStack_200 = (uv_loop_t *)0x178c97;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_200 = (uv_loop_t *)0x178c9c;
    puVar4 = uv_default_loop();
    puStack_200 = (uv_loop_t *)0x178ca4;
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    puStack_200 = (uv_loop_t *)0x178cb8;
    run_test_udp_open_bound_cold_1();
LAB_00178cb8:
    puStack_200 = (uv_loop_t *)0x178cbd;
    run_test_udp_open_bound_cold_2();
LAB_00178cbd:
    puStack_200 = (uv_loop_t *)0x178cc2;
    run_test_udp_open_bound_cold_3();
LAB_00178cc2:
    puStack_200 = (uv_loop_t *)0x178cc7;
    run_test_udp_open_bound_cold_4();
LAB_00178cc7:
    puStack_200 = (uv_loop_t *)0x178ccc;
    run_test_udp_open_bound_cold_5();
  }
  puStack_200 = (uv_loop_t *)run_test_udp_open_connect;
  run_test_udp_open_bound_cold_6();
  pcStack_3d8 = (code *)0x178cea;
  puStack_200 = puVar5;
  uStack_3d0 = uv_buf_init("PING",4);
  pcStack_3d8 = (code *)0x178d09;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_3c0);
  if (iVar1 == 0) {
    pcStack_3d8 = (code *)0x178d16;
    uVar3 = create_udp_socket();
    puVar5 = (uv_loop_t *)(ulong)uVar3;
    pcStack_3d8 = (code *)0x178d1d;
    puVar4 = uv_default_loop();
    pcStack_3d8 = (code *)0x178d2a;
    iVar1 = uv_udp_init(puVar4,&uStack_3b0);
    if (iVar1 != 0) goto LAB_00178e56;
    pcStack_3d8 = (code *)0x178d43;
    iVar1 = connect(uVar3,(sockaddr *)&sStack_3c0,0x10);
    if (iVar1 != 0) goto LAB_00178e5b;
    pcStack_3d8 = (code *)0x178d57;
    iVar1 = uv_udp_open(&uStack_3b0,uVar3);
    if (iVar1 != 0) goto LAB_00178e60;
    pcStack_3d8 = (code *)0x178d64;
    puVar4 = uv_default_loop();
    pcStack_3d8 = (code *)0x178d74;
    iVar1 = uv_udp_init(puVar4,&uStack_2d8);
    if (iVar1 != 0) goto LAB_00178e65;
    pcStack_3d8 = (code *)0x178d90;
    iVar1 = uv_udp_bind(&uStack_2d8,(sockaddr *)&sStack_3c0,0);
    if (iVar1 != 0) goto LAB_00178e6a;
    pcStack_3d8 = (code *)0x178db3;
    iVar1 = uv_udp_recv_start(&uStack_2d8,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_00178e6f;
    pcStack_3d8 = (code *)0x178dde;
    iVar1 = uv_udp_send(&send_req,&uStack_3b0,&uStack_3d0,1,(sockaddr *)0x0,send_cb);
    if (iVar1 != 0) goto LAB_00178e74;
    pcStack_3d8 = (code *)0x178deb;
    puVar4 = uv_default_loop();
    pcStack_3d8 = (code *)0x178df5;
    uv_run(puVar4,UV_RUN_DEFAULT);
    if (send_cb_called != 1) goto LAB_00178e79;
    if (close_cb_called != 2) goto LAB_00178e7e;
    if ((void *)uStack_3b0.send_queue_size != (void *)0x0) goto LAB_00178e83;
    pcStack_3d8 = (code *)0x178e17;
    puVar5 = uv_default_loop();
    pcStack_3d8 = (code *)0x178e2b;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    pcStack_3d8 = (code *)0x178e35;
    uv_run(puVar5,UV_RUN_DEFAULT);
    pcStack_3d8 = (code *)0x178e3a;
    puVar4 = uv_default_loop();
    pcStack_3d8 = (code *)0x178e42;
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    pcStack_3d8 = (code *)0x178e56;
    run_test_udp_open_connect_cold_1();
LAB_00178e56:
    pcStack_3d8 = (code *)0x178e5b;
    run_test_udp_open_connect_cold_2();
LAB_00178e5b:
    pcStack_3d8 = (code *)0x178e60;
    run_test_udp_open_connect_cold_3();
LAB_00178e60:
    pcStack_3d8 = (code *)0x178e65;
    run_test_udp_open_connect_cold_4();
LAB_00178e65:
    pcStack_3d8 = (code *)0x178e6a;
    run_test_udp_open_connect_cold_5();
LAB_00178e6a:
    pcStack_3d8 = (code *)0x178e6f;
    run_test_udp_open_connect_cold_6();
LAB_00178e6f:
    pcStack_3d8 = (code *)0x178e74;
    run_test_udp_open_connect_cold_7();
LAB_00178e74:
    pcStack_3d8 = (code *)0x178e79;
    run_test_udp_open_connect_cold_8();
LAB_00178e79:
    pcStack_3d8 = (code *)0x178e7e;
    run_test_udp_open_connect_cold_9();
LAB_00178e7e:
    pcStack_3d8 = (code *)0x178e83;
    run_test_udp_open_connect_cold_10();
LAB_00178e83:
    pcStack_3d8 = (code *)0x178e88;
    run_test_udp_open_connect_cold_11();
  }
  pcStack_3d8 = run_test_udp_send_unix;
  run_test_udp_open_connect_cold_12();
  puStack_3e0 = puVar5;
  pcStack_3d8 = (code *)(ulong)uVar2;
  uStack_678 = uv_buf_init("PING",4);
  puVar5 = uv_default_loop();
  uStack_64c = 0;
  uStack_644 = 0;
  uStack_63c = 0;
  uStack_634 = 0;
  uStack_62c = 0;
  uStack_624 = 0;
  uStack_61c = 0;
  uStack_614 = 0;
  uStack_60c = 0;
  uStack_608 = 0;
  uStack_604 = 0;
  uStack_600 = 0;
  auStack_666._0_2_ = 1;
  auStack_666[2] = '/';
  auStack_666[3] = 't';
  auStack_666[4] = 'm';
  auStack_666[5] = 'p';
  auStack_666[6] = '/';
  auStack_666[7] = 'u';
  auStack_666[8] = 'v';
  auStack_666[9] = '-';
  auStack_666[10] = 't';
  auStack_666[0xb] = 'e';
  auStack_666[0xc] = 's';
  auStack_666[0xd] = 't';
  auStack_666[0xe] = '-';
  auStack_666[0xf] = 's';
  auStack_666[0x10] = 'o';
  auStack_666[0x11] = 'c';
  uStack_654 = 0x6b;
  puVar4 = (uv_loop_t *)0x1;
  uVar2 = socket(1,1,0);
  if ((int)uVar2 < 0) {
    run_test_udp_send_unix_cold_1();
LAB_0017901c:
    run_test_udp_send_unix_cold_2();
LAB_00179021:
    run_test_udp_send_unix_cold_3();
LAB_00179026:
    run_test_udp_send_unix_cold_4();
LAB_0017902b:
    run_test_udp_send_unix_cold_5();
  }
  else {
    unlink("/tmp/uv-test-sock");
    puVar4 = (uv_loop_t *)(ulong)uVar2;
    iVar1 = bind(uVar2,(sockaddr *)auStack_666,0x6e);
    if (iVar1 != 0) goto LAB_0017901c;
    puVar4 = (uv_loop_t *)(ulong)uVar2;
    iVar1 = listen(uVar2,1);
    if (iVar1 != 0) goto LAB_00179021;
    puVar4 = puVar5;
    iVar1 = uv_udp_init(puVar5,(uv_udp_t *)auStack_5f8);
    if (iVar1 != 0) goto LAB_00179026;
    puVar4 = (uv_loop_t *)auStack_5f8;
    iVar1 = uv_udp_open((uv_udp_t *)puVar4,uVar2);
    if (iVar1 != 0) goto LAB_0017902b;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puVar4 = (uv_loop_t *)(auStack_5f8 + 0xd8);
    iVar1 = uv_udp_send((uv_udp_send_t *)puVar4,(uv_udp_t *)auStack_5f8,&uStack_678,1,
                        (sockaddr *)auStack_666,(uv_udp_send_cb)0x0);
    if (iVar1 == 0) {
      uv_close((uv_handle_t *)auStack_5f8,(uv_close_cb)0x0);
      uv_run(puVar5,UV_RUN_DEFAULT);
      close(uVar2);
      unlink("/tmp/uv-test-sock");
      puVar4 = uv_default_loop();
      uv_walk(puVar4,close_walk_cb,(void *)0x0);
      uv_run(puVar4,UV_RUN_DEFAULT);
      puVar4 = uv_default_loop();
      iVar1 = uv_loop_close(puVar4);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00179035;
    }
  }
  run_test_udp_send_unix_cold_6();
LAB_00179035:
  run_test_udp_send_unix_cold_7();
  if (puVar4 != (uv_loop_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)puVar4);
  if (iVar1 != 0) {
    return;
  }
  uv_close((uv_handle_t *)puVar4,(uv_close_cb)0x0);
  return;
}

Assistant:

static void alloc_cb(uv_handle_t* handle,
                     size_t suggested_size,
                     uv_buf_t* buf) {
  static char slab[65536];
  CHECK_HANDLE(handle);
  ASSERT(suggested_size <= sizeof(slab));
  buf->base = slab;
  buf->len = sizeof(slab);
}